

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathNormalizeFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathContextPtr pxVar1;
  ulong in_RAX;
  xmlChar *pxVar2;
  xmlXPathObjectPtr pxVar3;
  xmlBufPtr buf;
  ulong uVar4;
  xmlXPathObjectPtr value;
  int error;
  byte *str;
  xmlChar blank;
  undefined8 uStack_38;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  uStack_38 = in_RAX;
  if (nargs != 1) {
    if (nargs != 0) {
      error = 0xc;
      goto LAB_001e298f;
    }
    pxVar1 = ctxt->context;
    pxVar2 = xmlNodeGetContent(pxVar1->node);
    if (pxVar2 == (xmlChar *)0x0) {
      pxVar2 = xmlStrdup("");
    }
    pxVar3 = xmlXPathCacheWrapString(pxVar1,pxVar2);
    valuePush(ctxt,pxVar3);
  }
  if (ctxt->valueNr <= ctxt->valueFrame) {
    error = 0x17;
    goto LAB_001e298f;
  }
  if (ctxt->value == (xmlXPathObjectPtr)0x0) {
LAB_001e2987:
    error = 0xb;
LAB_001e298f:
    xmlXPathErr(ctxt,error);
    return;
  }
  if (ctxt->value->type != XPATH_STRING) {
    xmlXPathStringFunction(ctxt,1);
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_STRING))
    goto LAB_001e2987;
  }
  pxVar3 = valuePop(ctxt);
  str = pxVar3->stringval;
  buf = xmlBufCreate();
  if (str == (byte *)0x0 || buf == (xmlBufPtr)0x0) {
LAB_001e2a25:
    xmlXPathReleaseObject(ctxt->context,pxVar3);
    return;
  }
  while ((uVar4 = (ulong)*str, uVar4 < 0x21 && ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0))) {
    str = str + 1;
  }
  uStack_38 = uStack_38 & 0xffffffffffffff;
LAB_001e29ac:
  if ((byte)uVar4 < 0x21) {
    if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
      if (uVar4 != 0) goto LAB_001e29cd;
      pxVar1 = ctxt->context;
      pxVar2 = xmlBufContent(buf);
      value = xmlXPathCacheNewString(pxVar1,pxVar2);
      valuePush(ctxt,value);
      xmlBufFree(buf);
      goto LAB_001e2a25;
    }
    uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
  }
  else {
LAB_001e29cd:
    if (uStack_38._7_1_ != '\0') {
      xmlBufAdd(buf,(xmlChar *)((long)&uStack_38 + 7),1);
      uStack_38 = uStack_38 & 0xffffffffffffff;
    }
    xmlBufAdd(buf,str,1);
  }
  uVar4 = (ulong)str[1];
  str = str + 1;
  goto LAB_001e29ac;
}

Assistant:

void
xmlXPathNormalizeFunction(xmlXPathParserContextPtr ctxt, int nargs) {
  xmlXPathObjectPtr obj = NULL;
  xmlChar *source = NULL;
  xmlBufPtr target;
  xmlChar blank;

  if (ctxt == NULL) return;
  if (nargs == 0) {
    /* Use current context node */
      valuePush(ctxt,
	  xmlXPathCacheWrapString(ctxt->context,
	    xmlXPathCastNodeToString(ctxt->context->node)));
    nargs = 1;
  }

  CHECK_ARITY(1);
  CAST_TO_STRING;
  CHECK_TYPE(XPATH_STRING);
  obj = valuePop(ctxt);
  source = obj->stringval;

  target = xmlBufCreate();
  if (target && source) {

    /* Skip leading whitespaces */
    while (IS_BLANK_CH(*source))
      source++;

    /* Collapse intermediate whitespaces, and skip trailing whitespaces */
    blank = 0;
    while (*source) {
      if (IS_BLANK_CH(*source)) {
	blank = 0x20;
      } else {
	if (blank) {
	  xmlBufAdd(target, &blank, 1);
	  blank = 0;
	}
	xmlBufAdd(target, source, 1);
      }
      source++;
    }
    valuePush(ctxt, xmlXPathCacheNewString(ctxt->context,
	xmlBufContent(target)));
    xmlBufFree(target);
  }
  xmlXPathReleaseObject(ctxt->context, obj);
}